

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * substExpr(sqlite3 *db,Expr *pExpr,int iTable,ExprList *pEList)

{
  Expr *pEVar1;
  
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
  }
  else if ((pExpr->op == 0x98) && (pExpr->iTable == iTable)) {
    if ((long)pExpr->iColumn < 0) {
      pExpr->op = 'b';
    }
    else {
      pEVar1 = exprDup(db,pEList->a[pExpr->iColumn].pExpr,0,(u8 **)0x0);
      sqlite3ExprDelete(db,pExpr);
      pExpr = pEVar1;
    }
  }
  else {
    pEVar1 = substExpr(db,pExpr->pLeft,iTable,pEList);
    pExpr->pLeft = pEVar1;
    pEVar1 = substExpr(db,pExpr->pRight,iTable,pEList);
    pExpr->pRight = pEVar1;
    if ((pExpr->flags & 0x800) == 0) {
      substExprList(db,(pExpr->x).pList,iTable,pEList);
    }
    else {
      substSelect(db,(Select *)(pExpr->x).pList,iTable,pEList);
    }
  }
  return pExpr;
}

Assistant:

static Expr *substExpr(
  sqlite3 *db,        /* Report malloc errors to this connection */
  Expr *pExpr,        /* Expr in which substitution occurs */
  int iTable,         /* Table to be substituted */
  ExprList *pEList    /* Substitute expressions */
){
  if( pExpr==0 ) return 0;
  if( pExpr->op==TK_COLUMN && pExpr->iTable==iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      assert( pEList!=0 && pExpr->iColumn<pEList->nExpr );
      assert( pExpr->pLeft==0 && pExpr->pRight==0 );
      pNew = sqlite3ExprDup(db, pEList->a[pExpr->iColumn].pExpr, 0);
      sqlite3ExprDelete(db, pExpr);
      pExpr = pNew;
    }
  }else{
    pExpr->pLeft = substExpr(db, pExpr->pLeft, iTable, pEList);
    pExpr->pRight = substExpr(db, pExpr->pRight, iTable, pEList);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(db, pExpr->x.pSelect, iTable, pEList);
    }else{
      substExprList(db, pExpr->x.pList, iTable, pEList);
    }
  }
  return pExpr;
}